

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casts.h
# Opt level: O1

void __thiscall
CoreML::Specification::MILSpec::TensorValue::CheckTypeAndMergeFrom
          (TensorValue *this,MessageLite *from)

{
  ulong uVar1;
  LogMessage *other;
  TensorValue_RepeatedFloats *pTVar2;
  TensorValue_RepeatedLongInts *pTVar3;
  TensorValue_RepeatedBools *pTVar4;
  TensorValue_RepeatedStrings *pTVar5;
  TensorValue_RepeatedInts *pTVar6;
  TensorValue_RepeatedDoubles *pTVar7;
  TensorValue_RepeatedBytes *pTVar8;
  undefined1 *puVar9;
  Arena *pAVar10;
  LogFinisher LStack_51;
  LogMessage LStack_50;
  
  if (from->_vptr_MessageLite == (_func_int **)&PTR__TensorValue_004b2290) {
    if ((TensorValue *)from == this) {
      google::protobuf::internal::LogMessage::LogMessage
                (&LStack_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/MIL.pb.cc"
                 ,0x1f56);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&LStack_50,"CHECK failed: (&from) != (this): ");
      google::protobuf::internal::LogFinisher::operator=(&LStack_51,other);
      google::protobuf::internal::LogMessage::~LogMessage(&LStack_50);
    }
    switch(*(undefined4 *)((long)&from[1]._internal_metadata_.ptr_ + 4)) {
    case 1:
      if (this->_oneof_case_[0] != 1) {
        clear_value(this);
        this->_oneof_case_[0] = 1;
        uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
        pAVar10 = (Arena *)(uVar1 & 0xfffffffffffffffc);
        if ((uVar1 & 1) != 0) {
          pAVar10 = *(Arena **)pAVar10;
        }
        pTVar2 = google::protobuf::Arena::
                 CreateMaybeMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedFloats>
                           (pAVar10);
        (this->value_).floats_ = pTVar2;
      }
      if (*(int *)((long)&from[1]._internal_metadata_.ptr_ + 4) == 1) {
        puVar9 = (undefined1 *)from[1]._vptr_MessageLite;
      }
      else {
        puVar9 = _TensorValue_RepeatedFloats_default_instance_;
      }
      TensorValue_RepeatedFloats::MergeFrom
                ((this->value_).floats_,(TensorValue_RepeatedFloats *)puVar9);
      break;
    case 2:
      if (this->_oneof_case_[0] != 2) {
        clear_value(this);
        this->_oneof_case_[0] = 2;
        uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
        pAVar10 = (Arena *)(uVar1 & 0xfffffffffffffffc);
        if ((uVar1 & 1) != 0) {
          pAVar10 = *(Arena **)pAVar10;
        }
        pTVar6 = google::protobuf::Arena::
                 CreateMaybeMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedInts>
                           (pAVar10);
        (this->value_).ints_ = pTVar6;
      }
      if (*(int *)((long)&from[1]._internal_metadata_.ptr_ + 4) == 2) {
        puVar9 = (undefined1 *)from[1]._vptr_MessageLite;
      }
      else {
        puVar9 = _TensorValue_RepeatedInts_default_instance_;
      }
      TensorValue_RepeatedInts::MergeFrom((this->value_).ints_,(TensorValue_RepeatedInts *)puVar9);
      break;
    case 3:
      if (this->_oneof_case_[0] != 3) {
        clear_value(this);
        this->_oneof_case_[0] = 3;
        uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
        pAVar10 = (Arena *)(uVar1 & 0xfffffffffffffffc);
        if ((uVar1 & 1) != 0) {
          pAVar10 = *(Arena **)pAVar10;
        }
        pTVar4 = google::protobuf::Arena::
                 CreateMaybeMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedBools>
                           (pAVar10);
        (this->value_).bools_ = pTVar4;
      }
      if (*(int *)((long)&from[1]._internal_metadata_.ptr_ + 4) == 3) {
        puVar9 = (undefined1 *)from[1]._vptr_MessageLite;
      }
      else {
        puVar9 = _TensorValue_RepeatedBools_default_instance_;
      }
      TensorValue_RepeatedBools::MergeFrom
                ((this->value_).bools_,(TensorValue_RepeatedBools *)puVar9);
      break;
    case 4:
      if (this->_oneof_case_[0] != 4) {
        clear_value(this);
        this->_oneof_case_[0] = 4;
        uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
        pAVar10 = (Arena *)(uVar1 & 0xfffffffffffffffc);
        if ((uVar1 & 1) != 0) {
          pAVar10 = *(Arena **)pAVar10;
        }
        pTVar5 = google::protobuf::Arena::
                 CreateMaybeMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedStrings>
                           (pAVar10);
        (this->value_).strings_ = pTVar5;
      }
      if (*(int *)((long)&from[1]._internal_metadata_.ptr_ + 4) == 4) {
        puVar9 = (undefined1 *)from[1]._vptr_MessageLite;
      }
      else {
        puVar9 = _TensorValue_RepeatedStrings_default_instance_;
      }
      TensorValue_RepeatedStrings::MergeFrom
                ((this->value_).strings_,(TensorValue_RepeatedStrings *)puVar9);
      break;
    case 5:
      if (this->_oneof_case_[0] != 5) {
        clear_value(this);
        this->_oneof_case_[0] = 5;
        uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
        pAVar10 = (Arena *)(uVar1 & 0xfffffffffffffffc);
        if ((uVar1 & 1) != 0) {
          pAVar10 = *(Arena **)pAVar10;
        }
        pTVar3 = google::protobuf::Arena::
                 CreateMaybeMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedLongInts>
                           (pAVar10);
        (this->value_).longints_ = pTVar3;
      }
      if (*(int *)((long)&from[1]._internal_metadata_.ptr_ + 4) == 5) {
        puVar9 = (undefined1 *)from[1]._vptr_MessageLite;
      }
      else {
        puVar9 = _TensorValue_RepeatedLongInts_default_instance_;
      }
      TensorValue_RepeatedLongInts::MergeFrom
                ((this->value_).longints_,(TensorValue_RepeatedLongInts *)puVar9);
      break;
    case 6:
      if (this->_oneof_case_[0] != 6) {
        clear_value(this);
        this->_oneof_case_[0] = 6;
        uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
        pAVar10 = (Arena *)(uVar1 & 0xfffffffffffffffc);
        if ((uVar1 & 1) != 0) {
          pAVar10 = *(Arena **)pAVar10;
        }
        pTVar7 = google::protobuf::Arena::
                 CreateMaybeMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedDoubles>
                           (pAVar10);
        (this->value_).doubles_ = pTVar7;
      }
      if (*(int *)((long)&from[1]._internal_metadata_.ptr_ + 4) == 6) {
        puVar9 = (undefined1 *)from[1]._vptr_MessageLite;
      }
      else {
        puVar9 = _TensorValue_RepeatedDoubles_default_instance_;
      }
      TensorValue_RepeatedDoubles::MergeFrom
                ((this->value_).doubles_,(TensorValue_RepeatedDoubles *)puVar9);
      break;
    case 7:
      if (this->_oneof_case_[0] != 7) {
        clear_value(this);
        this->_oneof_case_[0] = 7;
        uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
        pAVar10 = (Arena *)(uVar1 & 0xfffffffffffffffc);
        if ((uVar1 & 1) != 0) {
          pAVar10 = *(Arena **)pAVar10;
        }
        pTVar8 = google::protobuf::Arena::
                 CreateMaybeMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedBytes>
                           (pAVar10);
        (this->value_).bytes_ = pTVar8;
      }
      if (*(int *)((long)&from[1]._internal_metadata_.ptr_ + 4) == 7) {
        puVar9 = (undefined1 *)from[1]._vptr_MessageLite;
      }
      else {
        puVar9 = _TensorValue_RepeatedBytes_default_instance_;
      }
      TensorValue_RepeatedBytes::MergeFrom
                ((this->value_).bytes_,(TensorValue_RepeatedBytes *)puVar9);
    }
    uVar1 = (from->_internal_metadata_).ptr_;
    if ((uVar1 & 1) != 0) {
      google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
                (&(this->super_MessageLite)._internal_metadata_,
                 (string *)((uVar1 & 0xfffffffffffffffc) + 8));
    }
    return;
  }
  __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/casts.h"
                ,0x5e,
                "To google::protobuf::internal::down_cast(From *) [To = const CoreML::Specification::MILSpec::TensorValue *, From = const google::protobuf::MessageLite]"
               );
}

Assistant:

inline To down_cast(From* f) {                   // so we only accept pointers
  // Ensures that To is a sub-type of From *.  This test is here only
  // for compile-time type checking, and has no overhead in an
  // optimized build at run-time, as it will be optimized away
  // completely.
  if (false) {
    implicit_cast<From*, To>(0);
  }

#if !defined(NDEBUG) && PROTOBUF_RTTI
  assert(f == nullptr || dynamic_cast<To>(f) != nullptr);  // RTTI: debug mode only!
#endif
  return static_cast<To>(f);
}